

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O1

void __thiscall GetUniquePathTest_OMPI_Test::TestBody(GetUniquePathTest_OMPI_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  size_type *psVar2;
  size_type *psVar3;
  char *pcVar4;
  undefined1 local_150 [8];
  WithEnv withOMPI;
  WithEnv withTestVar;
  string expectedPath;
  WithEnv withForced;
  AssertionResult gtest_ar_2;
  AssertHelper local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  
  psVar3 = &withTestVar.var._M_string_length;
  withOMPI.val.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withOMPI.val.field_2 + 8),"OMPI_HOME","");
  psVar2 = &withForced.var._M_string_length;
  expectedPath.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedPath.field_2 + 8),"/some/path","");
  WithEnv::WithEnv((WithEnv *)local_150,(string *)((long)&withOMPI.val.field_2 + 8),
                   (string *)((long)&expectedPath.field_2 + 8));
  if ((size_type *)expectedPath.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedPath.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if ((size_type *)withOMPI.val.field_2._8_8_ != psVar3) {
    operator_delete((void *)withOMPI.val.field_2._8_8_,withTestVar.var._M_string_length + 1);
  }
  expectedPath.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedPath.field_2 + 8),"GPROF_TEST_PATH","");
  psVar3 = &expectedPath._M_string_length;
  withTestVar.val.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withTestVar.val.field_2 + 8),"/var/log/some_file_name","");
  WithEnv::WithEnv((WithEnv *)((long)&withOMPI.val.field_2 + 8),
                   (string *)((long)&expectedPath.field_2 + 8),
                   (string *)((long)&withTestVar.val.field_2 + 8));
  if ((size_type *)withTestVar.val.field_2._8_8_ != psVar3) {
    operator_delete((void *)withTestVar.val.field_2._8_8_,expectedPath._M_string_length + 1);
  }
  if ((size_type *)expectedPath.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedPath.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  expectedPath.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedPath.field_2 + 8),"/var/log/some_file_name","");
  AppendPID((string *)((long)&withTestVar.val.field_2 + 8),
            (string *)((long)&expectedPath.field_2 + 8));
  if ((size_type *)expectedPath.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedPath.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_48,"expectedPath","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedPath.field_2 + 8));
  if ((size_type *)expectedPath.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedPath.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&expectedPath.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xad,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedPath.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedPath.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedPath.field_2._8_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_48,"expectedPath","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedPath.field_2 + 8));
  if ((size_type *)expectedPath.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedPath.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&expectedPath.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedPath.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedPath.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedPath.field_2._8_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  setenv((char *)withOMPI.val.field_2._8_8_,(char *)withTestVar.var.field_2._8_8_,1);
  puVar1 = &gtest_ar.message_;
  local_48 = (undefined1  [8])puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"GPROF_TEST_PATH_USE_PID","");
  withForced.val.field_2._8_8_ = &gtest_ar_2.message_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withForced.val.field_2 + 8),"1","");
  WithEnv::WithEnv((WithEnv *)((long)&expectedPath.field_2 + 8),(string *)local_48,
                   (string *)((long)&withForced.val.field_2 + 8));
  if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)withForced.val.field_2._8_8_ != &gtest_ar_2.message_) {
    operator_delete((void *)withForced.val.field_2._8_8_,
                    (long)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (local_48 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_48,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedPath","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (local_48 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_48,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_48);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xb6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)((long)*(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                           *)local_48 + 8))();
    }
  }
  if (gtest_ar_2._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_2._0_8_);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedPath","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (local_48 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_48,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_48);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xb9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)((long)*(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                           *)local_48 + 8))();
    }
  }
  if (gtest_ar_2._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_2._0_8_);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&expectedPath.field_2 + 8));
  if ((size_type *)withTestVar.val.field_2._8_8_ != psVar3) {
    operator_delete((void *)withTestVar.val.field_2._8_8_,expectedPath._M_string_length + 1);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&withOMPI.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_150);
  return;
}

Assistant:

TEST(GetUniquePathTest, OMPI) {
  WithEnv withOMPI("OMPI_HOME", "/some/path");
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  const auto expectedPath = AppendPID(TEST_VAL);

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedPath, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedPath, GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedPath, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedPath, GetTestPath());
}